

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocPageSegment(DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                   *segmentList,
                  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *pageAllocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  bool bVar1;
  uint uVar2;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  bool enableWriteBarrier_local;
  bool allocated_local;
  bool committed_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *pageAllocator_local;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *segmentList_local;
  
  segmentList_local =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
       PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,bool,bool,bool>
                 ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
                   *)segmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,
                  pageAllocator,committed,allocated,enableWriteBarrier);
  if ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentList_local ==
      (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    segmentList_local =
         (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         0x0;
  }
  else {
    uVar2 = 0;
    if (committed) {
      uVar2 = 0x1000;
    }
    bVar1 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::Initialize
                      ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentList_local,
                       uVar2 | pageAllocator->allocFlags,
                       (bool)(pageAllocator->excludeGuardPages & 1));
    if (!bVar1) {
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      RemoveHead<Memory::NoThrowHeapAllocator>
                (segmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
      segmentList_local =
           (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
           0x0;
    }
  }
  return (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentList_local;
}

Assistant:

TPageSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocPageSegment(
    DListBase<TPageSegment>& segmentList,
    PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment> * pageAllocator,
    bool committed, bool allocated, bool enableWriteBarrier)
{
    TPageSegment * segment = segmentList.PrependNode(&NoThrowNoMemProtectHeapAllocator::Instance,
        pageAllocator, committed, allocated, enableWriteBarrier);

    if (segment == nullptr)
    {
        return nullptr;
    }

    if (!segment->Initialize((committed ? MEM_COMMIT : 0) | pageAllocator->allocFlags, pageAllocator->excludeGuardPages))
    {
        segmentList.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
        return nullptr;
    }
    return segment;
}